

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySubImage3D.cpp
# Opt level: O2

IterateResult __thiscall
glcts::TextureCubeMapArraySubImage3D::iterate(TextureCubeMapArraySubImage3D *this)

{
  GLuint width;
  uint height;
  GLuint depth;
  uint uVar1;
  STORAGE_TYPE SVar2;
  long lVar3;
  char *description;
  GLboolean test_passed;
  SubImage3DCopyParams local_60;
  STORAGE_TYPE local_44;
  uint local_40;
  uint local_3c;
  long local_38;
  
  initTest(this);
  test_passed = '\x01';
  SVar2 = ST_MUTABLE;
  while (SVar2 != 2) {
    lVar3 = 8;
    local_44 = SVar2;
    while (lVar3 != 0x38) {
      width = *(GLuint *)((long)&m_n_resolutions + lVar3);
      height = *(uint *)((long)&m_n_storage_type + lVar3);
      depth = *(GLuint *)((long)&resolutions + lVar3);
      local_38 = lVar3;
      configureCubeMapArrayTexture(this,width,height,depth,local_44,0);
      local_60.m_zoffset = 0;
      local_60.m_xoffset = 0;
      local_60.m_yoffset = 0;
      local_60.m_depth = 1;
      local_60.m_width = width;
      local_60.m_height = height;
      configureDataBuffer(this,width,height,depth,&local_60,0);
      configurePixelUnpackBuffer(this,&local_60);
      configure2DTexture(this,&local_60);
      testTexSubImage3D(this,width,height,depth,&local_60,&test_passed);
      testCopyTexSubImage3D(this,width,height,depth,&local_60,&test_passed);
      deletePixelUnpackBuffer(this);
      delete2DTexture(this);
      local_60.m_width = width >> 1;
      local_60.m_height = height >> 1;
      local_60.m_yoffset = local_60.m_height;
      local_60.m_xoffset = local_60.m_width;
      local_60.m_zoffset = 0;
      local_60.m_depth = 1;
      local_40 = local_60.m_height;
      local_3c = local_60.m_width;
      configureDataBuffer(this,width,height,depth,&local_60,0);
      configurePixelUnpackBuffer(this,&local_60);
      configure2DTexture(this,&local_60);
      testTexSubImage3D(this,width,height,depth,&local_60,&test_passed);
      testCopyTexSubImage3D(this,width,height,depth,&local_60,&test_passed);
      deletePixelUnpackBuffer(this);
      delete2DTexture(this);
      local_60.m_xoffset = 0;
      local_60.m_yoffset = 0;
      local_60.m_zoffset = 0;
      local_60.m_width = width;
      local_60.m_height = height;
      local_60.m_depth = 6;
      configureDataBuffer(this,width,height,depth,&local_60,0);
      configurePixelUnpackBuffer(this,&local_60);
      testTexSubImage3D(this,width,height,depth,&local_60,&test_passed);
      deletePixelUnpackBuffer(this);
      local_60.m_xoffset = 0;
      local_60.m_yoffset = 0;
      local_60.m_zoffset = 3;
      local_60.m_width = width;
      local_60.m_height = height;
      local_60.m_depth = 6;
      configureDataBuffer(this,width,height,depth,&local_60,0);
      configurePixelUnpackBuffer(this,&local_60);
      testTexSubImage3D(this,width,height,depth,&local_60,&test_passed);
      deletePixelUnpackBuffer(this);
      uVar1 = local_3c;
      local_60.m_yoffset = local_40;
      local_60.m_xoffset = local_3c;
      local_60.m_zoffset = 0;
      local_60.m_width = local_3c;
      local_60.m_height = local_40;
      local_60.m_depth = 6;
      configureDataBuffer(this,width,height,depth,&local_60,0);
      configurePixelUnpackBuffer(this,&local_60);
      testTexSubImage3D(this,width,height,depth,&local_60,&test_passed);
      deletePixelUnpackBuffer(this);
      local_60.m_yoffset = local_40;
      local_60.m_xoffset = uVar1;
      local_60.m_zoffset = 3;
      local_60.m_width = uVar1;
      local_60.m_height = local_40;
      local_60.m_depth = 6;
      configureDataBuffer(this,width,height,depth,&local_60,0);
      configurePixelUnpackBuffer(this,&local_60);
      testTexSubImage3D(this,width,height,depth,&local_60,&test_passed);
      deletePixelUnpackBuffer(this);
      deleteCubeMapArrayTexture(this);
      lVar3 = local_38 + 0xc;
    }
    SVar2 = local_44 + ST_IMMUTABLE;
  }
  if (test_passed == '\0') {
    description = "Fail";
  }
  else {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
             (uint)(test_passed == '\0'),description);
  return STOP;
}

Assistant:

tcu::TestCase::IterateResult TextureCubeMapArraySubImage3D::iterate()
{
	initTest();

	glw::GLboolean test_passed = true;

	/* Execute test throught all storage types */
	for (glw::GLuint storage_index = 0; storage_index < m_n_storage_type; ++storage_index)
	{
		/* Execute test throught all texture resolutions */
		for (glw::GLuint resolution_index = 0; resolution_index < m_n_resolutions; ++resolution_index)
		{
			glw::GLuint width  = resolutions[resolution_index][DL_WIDTH];
			glw::GLuint height = resolutions[resolution_index][DL_HEIGHT];
			glw::GLuint depth  = resolutions[resolution_index][DL_DEPTH];

			configureCubeMapArrayTexture(width, height, depth, static_cast<STORAGE_TYPE>(storage_index), 0);

			/* A single whole layer-face at index 0 should be replaced (both functions) */
			SubImage3DCopyParams copy_params;
			copy_params.init(0, 0, 0, width, height, 1);

			configureDataBuffer(width, height, depth, copy_params, 0);
			configurePixelUnpackBuffer(copy_params);
			configure2DTexture(copy_params);
			testTexSubImage3D(width, height, depth, copy_params, test_passed);
			testCopyTexSubImage3D(width, height, depth, copy_params, test_passed);
			deletePixelUnpackBuffer();
			delete2DTexture();

			/* A region of a layer-face at index 0 should be replaced (both functions) */
			copy_params.init(width / 2, height / 2, 0, width / 2, height / 2, 1);

			configureDataBuffer(width, height, depth, copy_params, 0);
			configurePixelUnpackBuffer(copy_params);
			configure2DTexture(copy_params);
			testTexSubImage3D(width, height, depth, copy_params, test_passed);
			testCopyTexSubImage3D(width, height, depth, copy_params, test_passed);
			deletePixelUnpackBuffer();
			delete2DTexture();

			/* 6 layer-faces, making up a single layer, should be replaced (glTexSubImage3D() only) */
			copy_params.init(0, 0, 0, width, height, 6);

			configureDataBuffer(width, height, depth, copy_params, 0);
			configurePixelUnpackBuffer(copy_params);
			testTexSubImage3D(width, height, depth, copy_params, test_passed);
			deletePixelUnpackBuffer();

			/* 6 layer-faces, making up two different layers (for instance: three last layer-faces of
			 layer 1 and three first layer-faces of layer 2) should be replaced (glTexSubImage3D() only) */
			copy_params.init(0, 0, 3, width, height, 6);

			configureDataBuffer(width, height, depth, copy_params, 0);
			configurePixelUnpackBuffer(copy_params);
			testTexSubImage3D(width, height, depth, copy_params, test_passed);
			deletePixelUnpackBuffer();

			/* 6 layer-faces, making up a single layer, should be replaced (glTexSubImage3D() only),
			 but limited to a quad */
			copy_params.init(width / 2, height / 2, 0, width / 2, height / 2, 6);

			configureDataBuffer(width, height, depth, copy_params, 0);
			configurePixelUnpackBuffer(copy_params);
			testTexSubImage3D(width, height, depth, copy_params, test_passed);
			deletePixelUnpackBuffer();

			/* 6 layer-faces, making up two different layers (for instance: three last layer-faces of
			 layer 1 and three first layer-faces of layer 2) should be replaced (glTexSubImage3D() only),
			 but limited to a quad */
			copy_params.init(width / 2, height / 2, 3, width / 2, height / 2, 6);

			configureDataBuffer(width, height, depth, copy_params, 0);
			configurePixelUnpackBuffer(copy_params);
			testTexSubImage3D(width, height, depth, copy_params, test_passed);
			deletePixelUnpackBuffer();

			deleteCubeMapArrayTexture();
		}
	}

	if (test_passed)
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");

	return STOP;
}